

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  FloatFormat *samplings;
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  ostringstream *poVar5;
  ostream *poVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_3>_> *pVVar11;
  pointer pcVar12;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar13;
  Variable<tcu::Vector<float,_2>_> *pVVar14;
  double dVar15;
  undefined7 uVar16;
  pointer pVVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  undefined8 uVar21;
  long lVar22;
  IVal *pIVar23;
  IVal *value;
  IVal *value_00;
  undefined8 *puVar24;
  uint uVar25;
  undefined1 *puVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  int row;
  long lVar28;
  Interval *__return_storage_ptr___00;
  ulong size;
  IVal *pIVar29;
  long lVar30;
  char *pcVar31;
  _Base_ptr p_Var32;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar33;
  byte bVar34;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  IVal in1;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_> outputs;
  IVal reference0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa58;
  undefined1 local_5a0 [12];
  undefined4 uStack_594;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  undefined1 local_580 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  _Rb_tree_node_base *local_560;
  double local_558;
  TestLog *local_538;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *local_530;
  ulong local_528;
  long local_520;
  string local_518;
  TestStatus *local_4f8;
  FloatFormat *local_4f0;
  IVal local_4e8;
  ulong local_4b8;
  long local_4b0;
  FloatFormat local_4a8;
  long local_478;
  long local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  local_438;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  double local_3e8;
  Precision PStack_3e0;
  undefined4 uStack_3dc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3d8;
  undefined4 local_3d0;
  ios_base local_398 [8];
  ios_base local_390 [264];
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  bVar34 = 0;
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_4f8 = __return_storage_ptr__;
  iVar20 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4f0 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar20 + 0xdeadbeef),
             in_stack_fffffffffffffa58);
  pVVar17 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  size = ((long)local_278.in0.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_278.in0.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_438,size);
  local_4a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_4a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_4a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_4a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_4a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_4a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_4a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_538 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_438.out0.
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_438.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_408 + 8);
  local_530 = this;
  local_408._0_8_ = local_538;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(false);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_580 + 8);
  local_580._8_4_ = _S_red;
  local_570._M_allocated_capacity = 0;
  local_558 = 0.0;
  pSVar9 = (local_530->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_570._8_8_ = p_Var4;
  local_560 = p_Var4;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_580);
  if ((_Rb_tree_node_base *)local_570._8_8_ != p_Var4) {
    uVar21 = local_570._8_8_;
    do {
      (**(code **)(**(long **)(uVar21 + 0x20) + 0x30))(*(long **)(uVar21 + 0x20),local_1a8);
      uVar21 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar21);
    } while ((_Rb_tree_node_base *)uVar21 != p_Var4);
  }
  if (local_558 != 0.0) {
    poVar5 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,(char *)local_4e8.m_data[0]._0_8_,(long)local_4e8.m_data[0].m_lo);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((double *)local_4e8.m_data[0]._0_8_ != &local_4e8.m_data[0].m_hi) {
      operator_delete((void *)local_4e8.m_data[0]._0_8_,(long)local_4e8.m_data[0].m_hi + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_390);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_580);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pBVar33 = local_530;
  pSVar10 = (local_530->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  local_4b8 = size;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,size & 0xffffffff,&local_218,&local_288,0);
  lVar22 = 0x10;
  do {
    local_1a8[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_1a8 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x58);
  lVar22 = 0x10;
  do {
    local_1a8[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_1a8 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x58);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_408);
  lVar22 = 0x10;
  do {
    local_580[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_580 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_580 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x40);
  lVar22 = 0x10;
  do {
    local_580[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_580 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_580 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 == 0x28);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_468,
             (pBVar33->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (pBVar33->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4e8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (pBVar33->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_5a0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (pBVar33->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_518);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_468,
             (pBVar33->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr,
             (IVal *)local_408);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_468,
             (pBVar33->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_580);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar17) {
    local_528 = 0;
  }
  else {
    local_478 = local_4b8 + (local_4b8 == 0);
    local_520 = 0;
    local_528 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      lVar22 = 0x10;
      do {
        *(undefined1 *)((long)&local_4f8 + lVar22) = 0;
        *(undefined8 *)((long)&local_4f0 + lVar22) = 0x7ff0000000000000;
        *(undefined8 *)(&local_4e8.m_data[0].m_hasNaN + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x40);
      lVar22 = 0x10;
      do {
        *(undefined1 *)((long)&local_4f8 + lVar22) = 0;
        *(undefined8 *)((long)&local_4f0 + lVar22) = 0x7ff0000000000000;
        *(undefined8 *)(&local_4e8.m_data[0].m_hasNaN + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 == 0x28);
      local_4b0 = local_520 * 3;
      local_5a0._8_4_ =
           local_278.in0.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[local_520].m_data[2];
      local_5a0._0_8_ =
           *(undefined8 *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[local_520].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_580,local_4f0,(Vector<float,_3> *)local_5a0);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_408,local_4f0,(IVal *)local_580);
      pIVar23 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_468,
                           (pBVar33->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pIVar29 = (IVal *)local_408;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        uVar16 = *(undefined7 *)&pIVar29->m_data[0].field_0x1;
        pIVar23->m_data[0].m_hasNaN = pIVar29->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar23->m_data[0].field_0x1 = uVar16;
        pIVar29 = (IVal *)((long)pIVar29 + ((ulong)bVar34 * -2 + 1) * 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar34 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar33->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar33->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar33->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      PStack_3e0 = (pBVar33->m_caseCtx).precision;
      local_3e8 = local_4f0->m_maxValue;
      local_408._0_8_ = *(undefined8 *)local_4f0;
      local_408._8_4_ = local_4f0->m_fractionBits;
      local_408._12_4_ = local_4f0->m_hasSubnormal;
      local_3f8._M_allocated_capacity._0_4_ = local_4f0->m_hasInf;
      local_3f8._M_allocated_capacity._4_4_ = local_4f0->m_hasNaN;
      local_3f8._8_1_ = local_4f0->m_exactPrecision;
      local_3f8._9_3_ = *(undefined3 *)&local_4f0->field_0x19;
      local_3f8._12_4_ = *(undefined4 *)&local_4f0->field_0x1c;
      local_3d0 = 0;
      pSVar9 = (pBVar33->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_3d8 = &local_468;
      (*pSVar9->_vptr_Statement[3])(pSVar9,(IVal *)local_408);
      value = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_468,
                         (pBVar33->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_408,&local_4a8,value);
      local_4e8.m_data[0].m_lo = (double)CONCAT44(local_408._12_4_,local_408._8_4_);
      local_4e8.m_data[0].m_hi =
           (double)CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                            local_3f8._M_allocated_capacity._0_4_);
      local_4e8.m_data[1]._4_4_ = local_3f8._12_4_;
      local_4e8.m_data[1]._0_4_ = local_3f8._8_4_;
      local_4e8.m_data[1].m_hi = (double)CONCAT44(uStack_3dc,PStack_3e0);
      local_4e8.m_data[1].m_lo = local_3e8;
      local_4e8.m_data[0]._0_8_ = local_408._0_8_;
      local_470 = local_520 * 8;
      bVar18 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         (&local_4e8,
                          local_438.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_520);
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 1 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_1f8,bVar18,(string *)local_408);
      pBVar33 = local_530;
      if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
      }
      value_00 = Environment::lookup<tcu::Matrix<float,3,2>>
                           ((Environment *)&local_468,
                            (pBVar33->m_variables).out0.
                            super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                            .m_ptr);
      __return_storage_ptr___00 = (Interval *)local_408;
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)__return_storage_ptr___00,&local_4a8,value_00);
      lVar22 = local_4b0;
      puVar26 = local_1a8;
      lVar28 = 0;
      do {
        lVar30 = 0;
        do {
          *(undefined8 *)(puVar26 + lVar30 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar30);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar30;
          dVar15 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar26 + lVar30) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar26 + lVar30) + 8) = dVar15;
          lVar30 = lVar30 + 0x48;
        } while (lVar30 == 0x48);
        lVar28 = lVar28 + 1;
        puVar26 = puVar26 + 0x18;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar28 != 3);
      bVar19 = contains<tcu::Matrix<float,3,2>>
                         ((IVal *)local_1a8,
                          (Matrix<float,_3,_2> *)
                          (((local_438.out0.
                             super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                          local_4b0 * 2));
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 0 is outside acceptable range","");
      bVar19 = tcu::ResultCollector::check(&local_1f8,bVar19,(string *)local_408);
      if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
      }
      pBVar33 = local_530;
      uVar25 = (int)local_528 + ((byte)~(bVar18 && bVar19) & 1);
      local_528 = (ulong)uVar25;
      if ((int)uVar25 < 0x65 && (!bVar18 || !bVar19)) {
        local_408._0_8_ = local_538;
        poVar5 = (ostringstream *)(local_408 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        pcVar31 = "Failed";
        if (bVar18 && bVar19) {
          pcVar31 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,pcVar31,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar11 = (pBVar33->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        paVar27 = &local_570;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_580._0_8_ = paVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_580,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_408 + 8),(char *)local_580._0_8_,
                   CONCAT44(local_580._12_4_,local_580._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_408 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_5a0,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   ((local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + local_4b0),
                   (Vector<float,_3> *)paVar27);
        poVar6 = (ostream *)(local_408 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_5a0._0_8_,CONCAT44(uStack_594,local_5a0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._0_8_ != &local_590) {
          operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._0_8_ != &local_570) {
          operator_delete((void *)local_580._0_8_,(ulong)(local_570._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        pVVar13 = (pBVar33->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
                  m_ptr;
        paVar27 = &local_570;
        pcVar12 = (pVVar13->m_name)._M_dataplus._M_p;
        local_580._0_8_ = paVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_580,pcVar12,pcVar12 + (pVVar13->m_name)._M_string_length);
        poVar6 = (ostream *)(local_408 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_580._0_8_,CONCAT44(local_580._12_4_,local_580._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  ((string *)local_5a0,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   (((local_438.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar22 * 2),(Matrix<float,_3,_2> *)paVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_5a0._0_8_,CONCAT44(uStack_594,local_5a0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,2>>
                  (&local_518,(shaderexecutor *)&local_4a8,(FloatFormat *)local_1a8,(IVal *)paVar27)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._0_8_ != &local_590) {
          operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._0_8_ != &local_570) {
          operator_delete((void *)local_580._0_8_,(ulong)(local_570._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        pVVar14 = (pBVar33->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        paVar27 = &local_570;
        pcVar12 = (pVVar14->m_name)._M_dataplus._M_p;
        local_580._0_8_ = paVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_580,pcVar12,pcVar12 + (pVVar14->m_name)._M_string_length);
        poVar6 = (ostream *)(local_408 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_580._0_8_,CONCAT44(local_580._12_4_,local_580._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_5a0,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   ((long)(local_438.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_470),
                   (Vector<float,_2> *)&paVar27->_M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_5a0._0_8_,CONCAT44(uStack_594,local_5a0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_518,(shaderexecutor *)&local_4a8,(FloatFormat *)&local_4e8,(IVal *)paVar27
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._0_8_ != &local_590) {
          operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._0_8_ != &local_570) {
          operator_delete((void *)local_580._0_8_,(ulong)(local_570._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_408 + 8));
        std::ios_base::~ios_base(local_390);
      }
      local_520 = local_520 + 1;
    } while (local_520 != local_478);
  }
  iVar20 = (int)local_528;
  if (100 < iVar20) {
    poVar5 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
    std::ostream::operator<<(poVar5,iVar20 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_390);
  }
  poVar5 = (ostringstream *)(local_408 + 8);
  if (iVar20 == 0) {
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_390);
  if (iVar20 == 0) {
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_408 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Pass","");
    local_4f8->m_code = QP_TEST_RESULT_PASS;
    (local_4f8->m_description)._M_dataplus._M_p = (pointer)&(local_4f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f8->m_description,local_408._0_8_,
               (char *)(local_408._0_8_ + CONCAT44(local_408._12_4_,local_408._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_408 + 0x10)) goto LAB_009732d2;
    uVar21 = (_Base_ptr)
             CONCAT44(local_3f8._M_allocated_capacity._4_4_,local_3f8._M_allocated_capacity._0_4_);
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    std::ostream::operator<<(local_408,iVar20);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    std::ios_base::~ios_base(local_398);
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_408 + 0x10);
    local_408._0_8_ = paVar27;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(local_408._12_4_,local_408._8_4_) +
             CONCAT44(local_580._12_4_,local_580._8_4_));
    uVar21 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._0_8_ != &local_570) {
      uVar21 = local_570._M_allocated_capacity;
    }
    if ((ulong)uVar21 < p_Var3) {
      p_Var32 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != paVar27) {
        p_Var32 = (_Base_ptr)
                  CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                           local_3f8._M_allocated_capacity._0_4_);
      }
      if (p_Var32 < p_Var3) goto LAB_00973159;
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,local_580._0_8_);
    }
    else {
LAB_00973159:
      puVar24 = (undefined8 *)std::__cxx11::string::_M_append(local_580,local_408._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar24 + 2);
    if ((double *)*puVar24 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar24 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar24 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar24;
    }
    local_1a8._8_8_ = puVar24[1];
    *puVar24 = pdVar1;
    puVar24[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_4f8->m_code = QP_TEST_RESULT_FAIL;
    (local_4f8->m_description)._M_dataplus._M_p = (pointer)&(local_4f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f8->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ != paVar27) {
      operator_delete((void *)local_408._0_8_,
                      CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                               local_3f8._M_allocated_capacity._0_4_) + 1);
    }
    uVar21 = local_570._M_allocated_capacity;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_580._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._0_8_ == &local_570) goto LAB_009732d2;
  }
  operator_delete(paVar27,(ulong)((long)&((_Base_ptr)uVar21)->_M_color + 1));
LAB_009732d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  if (local_438.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_4f8;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}